

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O2

void __thiscall
agg::pod_vector<agg::cell_aa_*>::capacity(pod_vector<agg::cell_aa_*> *this,uint cap,uint extra_tail)

{
  cell_aa **ppcVar1;
  uint num;
  
  this->m_size = 0;
  if (this->m_capacity < cap) {
    pod_allocator<agg::cell_aa_*>::deallocate(this->m_array,this->m_capacity);
    num = extra_tail + cap;
    this->m_capacity = num;
    if (num == 0) {
      ppcVar1 = (cell_aa **)0x0;
    }
    else {
      ppcVar1 = pod_allocator<agg::cell_aa_*>::allocate(num);
    }
    this->m_array = ppcVar1;
  }
  return;
}

Assistant:

void pod_vector<T>::capacity(unsigned cap, unsigned extra_tail)
    {
        m_size = 0;
        if(cap > m_capacity)
        {
            pod_allocator<T>::deallocate(m_array, m_capacity);
            m_capacity = cap + extra_tail;
            m_array = m_capacity ? pod_allocator<T>::allocate(m_capacity) : 0;
        }
    }